

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O1

void FT_List_Add(FT_List list,FT_ListNode node)

{
  FT_ListNode pFVar1;
  FT_List pFVar2;
  
  if (node != (FT_ListNode)0x0 && list != (FT_List)0x0) {
    pFVar1 = list->tail;
    node->next = (FT_ListNode)0x0;
    node->prev = pFVar1;
    pFVar2 = (FT_List)&pFVar1->next;
    if (pFVar1 == (FT_ListNode)0x0) {
      pFVar2 = list;
    }
    pFVar2->head = node;
    list->tail = node;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_List_Add( FT_List      list,
               FT_ListNode  node )
  {
    FT_ListNode  before;


    if ( !list || !node )
      return;

    before = list->tail;

    node->next = NULL;
    node->prev = before;

    if ( before )
      before->next = node;
    else
      list->head = node;

    list->tail = node;
  }